

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentence_test.cpp
# Opt level: O0

void __thiscall
jhu::thrax::SentenceTests_EmptyString_Test::TestBody(SentenceTests_EmptyString_Test *this)

{
  string_view line_00;
  bool bVar1;
  char *message;
  AssertHelper local_88;
  Message local_80 [3];
  size_type local_68;
  undefined4 local_5c;
  undefined1 local_58 [8];
  AssertionResult gtest_ar;
  undefined1 local_38 [8];
  Sentence s;
  string_view line;
  SentenceTests_EmptyString_Test *this_local;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             &s.
              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"");
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       s.
       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  line_00._M_str = (char *)line._M_len;
  line_00._M_len =
       (size_t)s.
               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  tokens<false>((Sentence *)local_38,line_00);
  local_5c = 0;
  local_68 = std::
             vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::size((Sentence *)local_38);
  testing::internal::EqHelper<true>::Compare<int,unsigned_long>
            (local_58,"0",(int *)0x185dc6,(unsigned_long *)&local_5c,&local_68);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(local_80);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/sentence_test.cpp"
               ,9,message);
    testing::internal::AssertHelper::operator=(&local_88,local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *)local_38);
  return;
}

Assistant:

TEST(SentenceTests, EmptyString) {
  std::string_view line = "";
  auto s = tokens<false>(line);
  EXPECT_EQ(0, s.size());
}